

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O3

void __thiscall Timidity::SF2Envelope::ApplyToAmp(SF2Envelope *this,Voice *v)

{
  BYTE BVar1;
  final_volume_t fVar2;
  double dVar3;
  double dVar4;
  
  BVar1 = (this->super_MinEnvelope).stage;
  if (BVar1 == '\0') {
    v->left_mix = 0.0;
    fVar2 = 0.0;
  }
  else {
    if (v->sample->type == '\x02') {
      dVar3 = (double)v->attenuation * -0.006249994063858491;
    }
    else {
      dVar3 = (double)v->attenuation * -0.01660964047443681;
    }
    dVar3 = exp2(dVar3);
    if (BVar1 != '\x02') {
      if (BVar1 == '\x01') {
        dVar4 = (double)this->volume;
      }
      else {
        dVar4 = exp2((double)this->volume * -0.01660964047443681);
      }
      dVar3 = dVar3 * dVar4;
    }
    v->left_mix = (float)((double)v->left_offset * dVar3 * 0.25);
    fVar2 = (final_volume_t)((double)v->right_offset * dVar3 * 0.25);
  }
  v->right_mix = fVar2;
  return;
}

Assistant:

void SF2Envelope::ApplyToAmp(Voice *v)
{
	double amp;

	if (stage == SF2_DELAY)
	{
		v->left_mix = 0;
		v->right_mix = 0;
		return;
	}

	amp = v->sample->type == INST_SF2 ? atten2amp(v->attenuation) : cb_to_amp(v->attenuation);

	switch (stage)
	{
	case SF2_ATTACK:
		amp *= volume;
		break;

	case SF2_HOLD:
		break;

	default:
		amp *= cb_to_amp(volume);
		break;
	}
	amp *= FINAL_MIX_SCALE * 0.5;
	v->left_mix = float(amp * v->left_offset);
	v->right_mix = float(amp * v->right_offset);
}